

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void EXRSetNameAttr(EXRHeader *exr_header,char *name)

{
  size_t sVar1;
  size_t __n;
  
  if (exr_header != (EXRHeader *)0x0) {
    memset(exr_header->name,0,0x100);
    if (name != (char *)0x0) {
      sVar1 = strlen(name);
      if (sVar1 != 0) {
        __n = 0xff;
        if (sVar1 < 0xff) {
          __n = sVar1;
        }
        memcpy(exr_header->name,name,__n);
        return;
      }
    }
  }
  return;
}

Assistant:

void EXRSetNameAttr(EXRHeader* exr_header, const char* name) {
  if (exr_header == NULL) {
    return;
  }
  memset(exr_header->name, 0, 256);
  if (name != NULL) {
    size_t len = std::min(strlen(name), size_t(255));
    if (len) {
      memcpy(exr_header->name, name, len);
    }
  }
}